

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extradata.cpp
# Opt level: O0

void __thiscall
icu_63::ExtraData::writeCompositions(ExtraData *this,UChar32 c,Norm *norm,UnicodeString *dataString)

{
  CompositionPair *pCVar1;
  Norm *pNVar2;
  UnicodeString *this_00;
  CompositionPair *pCVar3;
  int local_58;
  char16_t local_54;
  int32_t thirdUnit;
  int32_t secondUnit;
  int32_t firstUnit;
  UChar32 compositeAndFwd;
  CompositionPair *pair;
  int32_t i;
  CompositionPair *pairs;
  UnicodeString *pUStack_28;
  int32_t length;
  UnicodeString *dataString_local;
  Norm *norm_local;
  ExtraData *pEStack_10;
  UChar32 c_local;
  ExtraData *this_local;
  
  pUStack_28 = dataString;
  dataString_local = (UnicodeString *)norm;
  norm_local._4_4_ = c;
  pEStack_10 = this;
  if (norm->cc == '\0') {
    pCVar1 = Norm::getCompositionPairs(norm,(int32_t *)((long)&pairs + 4));
    for (pair._4_4_ = 0; pair._4_4_ < pairs._4_4_; pair._4_4_ = pair._4_4_ + 1) {
      pCVar3 = pCVar1 + (long)pair._4_4_ * 8;
      secondUnit = *(int *)(pCVar3 + 4) << 1;
      pNVar2 = Norms::getNormRef((this->super_Enumerator).norms,*(UChar32 *)(pCVar3 + 4));
      if (pNVar2->compositions != (UVector32 *)0x0) {
        secondUnit = secondUnit | 1;
      }
      local_54 = (char16_t)((uint)secondUnit >> 0x10);
      if (*(int *)pCVar3 < 0x3400) {
        if (secondUnit < 0x10000) {
          thirdUnit._0_2_ = (char16_t)(*(int *)pCVar3 << 1);
          local_54 = (char16_t)secondUnit;
          local_58 = -1;
        }
        else {
          thirdUnit._0_2_ = (ushort)(*(int *)pCVar3 << 1) | 1;
          local_58 = secondUnit;
        }
      }
      else {
        thirdUnit._0_2_ = (short)(*(int *)pCVar3 >> 9) + 0x3400U | 1;
        local_54 = (ushort)(*(int *)pCVar3 << 6) | local_54;
        local_58 = secondUnit;
      }
      if (pair._4_4_ == pairs._4_4_ + -1) {
        thirdUnit._0_2_ = (char16_t)thirdUnit | 0x8000;
      }
      this_00 = UnicodeString::append(pUStack_28,(char16_t)thirdUnit);
      UnicodeString::append(this_00,local_54);
      if (-1 < local_58) {
        UnicodeString::append(pUStack_28,(char16_t)local_58);
      }
    }
    return;
  }
  fprintf(_stderr,
          "gennorm2 error: U+%04lX combines-forward and has ccc!=0, not possible in Unicode normalization\n"
          ,(long)c);
  exit(3);
}

Assistant:

void ExtraData::writeCompositions(UChar32 c, const Norm &norm, UnicodeString &dataString) {
    if(norm.cc!=0) {
        fprintf(stderr,
                "gennorm2 error: "
                "U+%04lX combines-forward and has ccc!=0, not possible in Unicode normalization\n",
                (long)c);
        exit(U_INVALID_FORMAT_ERROR);
    }
    int32_t length;
    const CompositionPair *pairs=norm.getCompositionPairs(length);
    for(int32_t i=0; i<length; ++i) {
        const CompositionPair &pair=pairs[i];
        // 22 bits for the composite character and whether it combines forward.
        UChar32 compositeAndFwd=pair.composite<<1;
        if(norms.getNormRef(pair.composite).compositions!=NULL) {
            compositeAndFwd|=1;  // The composite character also combines-forward.
        }
        // Encode most pairs in two units and some in three.
        int32_t firstUnit, secondUnit, thirdUnit;
        if(pair.trail<Normalizer2Impl::COMP_1_TRAIL_LIMIT) {
            if(compositeAndFwd<=0xffff) {
                firstUnit=pair.trail<<1;
                secondUnit=compositeAndFwd;
                thirdUnit=-1;
            } else {
                firstUnit=(pair.trail<<1)|Normalizer2Impl::COMP_1_TRIPLE;
                secondUnit=compositeAndFwd>>16;
                thirdUnit=compositeAndFwd;
            }
        } else {
            firstUnit=(Normalizer2Impl::COMP_1_TRAIL_LIMIT+
                       (pair.trail>>Normalizer2Impl::COMP_1_TRAIL_SHIFT))|
                      Normalizer2Impl::COMP_1_TRIPLE;
            secondUnit=(pair.trail<<Normalizer2Impl::COMP_2_TRAIL_SHIFT)|
                       (compositeAndFwd>>16);
            thirdUnit=compositeAndFwd;
        }
        // Set the high bit of the first unit if this is the last composition pair.
        if(i==(length-1)) {
            firstUnit|=Normalizer2Impl::COMP_1_LAST_TUPLE;
        }
        dataString.append((UChar)firstUnit).append((UChar)secondUnit);
        if(thirdUnit>=0) {
            dataString.append((UChar)thirdUnit);
        }
    }
}